

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText,capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>
               (NodeText *location,NodeText *params)

{
  NodeText *this;
  NodeText *pNVar1;
  NodeText *params_local;
  NodeText *location_local;
  
  this = (NodeText *)operator_new(0x1c0,location);
  if (this != (NodeText *)0x0) {
    pNVar1 = fwd<capnp::(anonymous_namespace)::CapnpcCppMain::NodeText>(params);
    capnp::anon_unknown_1::CapnpcCppMain::NodeText::NodeText(this,pNVar1);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}